

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionElasticPdu.cpp
# Opt level: O0

void __thiscall
DIS::CollisionElasticPdu::unmarshal(CollisionElasticPdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  CollisionElasticPdu *this_local;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_issuingEntityID,dataStream);
  EntityID::unmarshal(&this->_collidingEntityID,dataStream);
  EventIdentifier::unmarshal(&this->_collisionEventID,dataStream);
  DataStream::operator>>(dataStream,&this->_pad);
  Vector3Float::unmarshal(&this->_contactVelocity,dataStream);
  DataStream::operator>>(dataStream,&this->_mass);
  Vector3Float::unmarshal(&this->_locationOfImpact,dataStream);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultXX);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultXY);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultXZ);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultYY);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultYZ);
  DataStream::operator>>(dataStream,&this->_collisionIntermediateResultZZ);
  Vector3Float::unmarshal(&this->_unitSurfaceNormal,dataStream);
  DataStream::operator>>(dataStream,&this->_coefficientOfRestitution);
  return;
}

Assistant:

void CollisionElasticPdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _issuingEntityID.unmarshal(dataStream);
    _collidingEntityID.unmarshal(dataStream);
    _collisionEventID.unmarshal(dataStream);
    dataStream >> _pad;
    _contactVelocity.unmarshal(dataStream);
    dataStream >> _mass;
    _locationOfImpact.unmarshal(dataStream);
    dataStream >> _collisionIntermediateResultXX;
    dataStream >> _collisionIntermediateResultXY;
    dataStream >> _collisionIntermediateResultXZ;
    dataStream >> _collisionIntermediateResultYY;
    dataStream >> _collisionIntermediateResultYZ;
    dataStream >> _collisionIntermediateResultZZ;
    _unitSurfaceNormal.unmarshal(dataStream);
    dataStream >> _coefficientOfRestitution;
}